

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O2

bool __thiscall
mp::NLSolver::LoadModel<mp::NLW2_NLFeeder_C_Impl>(NLSolver *this,NLW2_NLFeeder_C_Impl *nlf)

{
  WriteNLResult result;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->filestub_)._M_string_length == 0) {
    InitAutoStub(this);
  }
  WriteNLFile<mp::NLW2_NLFeeder_C_Impl>((WriteNLResult *)local_70,&this->filestub_,nlf,this->p_ut_);
  if (local_70._0_4_ != NLW2_WriteNL_OK) {
    std::operator+(&local_48,"WriteNL error: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_70 + 8));
    std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)(local_70 + 8));
  return local_70._0_4_ == NLW2_WriteNL_OK;
}

Assistant:

bool NLSolver::LoadModel(NLFeeder& nlf) {
  if (GetFileStub().empty())
    InitAutoStub();
  auto result = mp::WriteNLFile(GetFileStub(), nlf, Utils());
  if (NLW2_WriteNL_OK != result.first)
    return (err_msg_ = "WriteNL error: " + result.second, false);
  return true;
}